

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_plt_header(FILE *file,REF_INT *nvar,REF_LIST zone_type,REF_LIST zone_packing,
                   REF_LIST zone_nnode,REF_LIST zone_nelem)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  char *pcVar5;
  size_t sVar6;
  int maxlen;
  int maxlen_00;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar8;
  undefined8 uVar9;
  double dVar10;
  double dVar11;
  float zonemarker;
  int miscellaneous;
  int aux;
  int dim;
  int numelem;
  int neighbor;
  int location;
  int packing;
  int zonetype;
  int notused;
  int numvar;
  int filetype;
  int endian;
  char header [9];
  int auxiliary_value_format;
  int strand;
  int parent;
  double solutiontime;
  char auxvalue [1024];
  char auxname [1024];
  char zonename [1024];
  char varname [1024];
  char title [1024];
  float local_14b0;
  int local_14ac;
  int local_14a8;
  int local_14a4;
  REF_INT local_14a0;
  int local_149c;
  int local_1498;
  REF_INT local_1494;
  REF_INT local_1490;
  int local_148c;
  int local_1488;
  int local_1484;
  int local_1480;
  char local_1479 [4];
  undefined1 local_1475;
  undefined1 local_1474;
  REF_LIST local_1470;
  REF_LIST local_1468;
  REF_LIST local_1460;
  REF_LIST local_1458;
  undefined1 local_144c [4];
  undefined1 local_1448 [4];
  undefined1 local_1444 [4];
  undefined1 local_1440 [8];
  char local_1438 [1024];
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  local_1458 = zone_nelem;
  pcVar5 = fgets(local_1479,6,(FILE *)file);
  if (local_1479 == pcVar5) {
    local_1474 = 0;
    local_1470 = zone_nnode;
    local_1468 = zone_packing;
    local_1460 = zone_type;
    iVar2 = strncmp(local_1479,"#!TDV",5);
    if (iVar2 == 0) {
      pcVar5 = fgets(local_1479,4,(FILE *)file);
      if (local_1479 != pcVar5) {
        pcVar5 = "version error";
        uVar7 = 0x91c;
        goto LAB_002017e2;
      }
      local_1475 = 0;
      iVar2 = strncmp(local_1479,"112",5);
      if (iVar2 != 0) {
        sVar6 = (size_t)iVar2;
        pcVar5 = "expected version \'112\'";
        uVar7 = 0x91e;
        goto LAB_00201847;
      }
      sVar6 = fread(&local_1480,4,1,(FILE *)file);
      if (sVar6 == 1) {
        sVar6 = (size_t)local_1480;
        if (sVar6 == 1) {
          sVar6 = fread(&local_1484,4,1,(FILE *)file);
          if (sVar6 == 1) {
            sVar6 = (size_t)local_1484;
            if (sVar6 != 0) {
              pcVar5 = "expected full filetype";
              uVar7 = 0x923;
              goto LAB_00201847;
            }
            uVar3 = ref_part_plt_string(file,local_438,maxlen);
            if (uVar3 != 0) {
              pcVar5 = "read title";
              uVar7 = 0x925;
LAB_00201a40:
              uVar8 = (ulong)uVar3;
LAB_00201a43:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar7,"ref_part_plt_header",uVar8,pcVar5);
              return uVar3;
            }
            sVar6 = fread(&local_1488,4,1,(FILE *)file);
            if (sVar6 == 1) {
              *nvar = local_1488;
              if (0 < local_1488) {
                uVar7 = extraout_RDX;
                iVar2 = local_1488;
                do {
                  RVar4 = ref_part_plt_string(file,local_838,(int)uVar7);
                  if (RVar4 != 0) {
                    pcVar5 = "read variable name";
                    uVar7 = 0x92d;
                    goto LAB_00201c2b;
                  }
                  iVar2 = iVar2 + -1;
                  uVar7 = extraout_RDX_00;
                } while (iVar2 != 0);
              }
              sVar6 = fread(&local_14b0,4,1,(FILE *)file);
              if (sVar6 == 1) {
                uVar7 = extraout_RDX_01;
                do {
                  fVar1 = 799.0 - local_14b0;
                  if (fVar1 <= -fVar1) {
                    fVar1 = -fVar1;
                  }
                  if (1e-07 <= fVar1) {
                    goto LAB_00201c4e;
                  }
                  RVar4 = ref_part_plt_string(file,local_1038,(int)uVar7);
                  if (RVar4 != 0) {
                    pcVar5 = "read auxname";
                    uVar7 = 0x934;
                    goto LAB_00201c2b;
                  }
                  sVar6 = fread(local_144c,4,1,(FILE *)file);
                  if (sVar6 != 1) {
                    pcVar5 = "auxiliary_value_format";
                    uVar9 = 1;
                    uVar7 = 0x937;
                    goto LAB_0020184a;
                  }
                  RVar4 = ref_part_plt_string(file,local_1438,maxlen_00);
                  if (RVar4 != 0) {
                    pcVar5 = "read auxvalue";
                    uVar7 = 0x938;
                    goto LAB_00201c2b;
                  }
                  sVar6 = fread(&local_14b0,4,1,(FILE *)file);
                  uVar7 = extraout_RDX_02;
                } while (sVar6 == 1);
                pcVar5 = "zonemarker";
                uVar9 = 1;
                uVar7 = 0x93a;
              }
              else {
                pcVar5 = "zonemarker";
                uVar9 = 1;
                uVar7 = 0x931;
              }
            }
            else {
              pcVar5 = "numvar";
              uVar9 = 1;
              uVar7 = 0x928;
            }
          }
          else {
            pcVar5 = "filetype";
            uVar9 = 1;
            uVar7 = 0x922;
          }
        }
        else {
          pcVar5 = "expected little endian plt";
          uVar9 = 1;
          uVar7 = 0x921;
        }
      }
      else {
        pcVar5 = "magic";
        uVar9 = 1;
        uVar7 = 0x920;
      }
    }
    else {
      sVar6 = (size_t)iVar2;
      pcVar5 = "header \'#!TDV\' missing";
      uVar7 = 0x91b;
LAB_00201847:
      uVar9 = 0;
    }
LAB_0020184a:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
           "ref_part_plt_header",pcVar5,uVar9,sVar6);
  }
  else {
    pcVar5 = "header error";
    uVar7 = 0x919;
LAB_002017e2:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
           "ref_part_plt_header",pcVar5);
  }
  return 1;
  while( true ) {
    sVar6 = fread(local_1448,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "strand";
      uVar9 = 1;
      uVar7 = 0x942;
      goto LAB_0020184a;
    }
    sVar6 = fread(local_1440,8,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "solutiontime";
      uVar9 = 1;
      uVar7 = 0x943;
      goto LAB_0020184a;
    }
    sVar6 = fread(&local_148c,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "notused";
      uVar9 = 1;
      uVar7 = 0x944;
      goto LAB_0020184a;
    }
    sVar6 = (size_t)local_148c;
    if (sVar6 != 0xffffffffffffffff) {
      pcVar5 = "not unused should be -1 plt";
      uVar7 = 0x945;
      uVar9 = 0xffffffffffffffff;
      goto LAB_0020184a;
    }
    sVar6 = fread(&local_1490,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "zonetype";
      uVar9 = 1;
      uVar7 = 0x946;
      goto LAB_0020184a;
    }
    uVar3 = ref_list_push(local_1460,local_1490);
    if (uVar3 != 0) {
      pcVar5 = "save zonetype";
      uVar7 = 0x947;
      goto LAB_00201a40;
    }
    sVar6 = fread(&local_1494,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "packing";
      uVar9 = 1;
      uVar7 = 0x948;
      goto LAB_0020184a;
    }
    uVar3 = ref_list_push(local_1468,local_1494);
    if (uVar3 != 0) {
      pcVar5 = "save packing";
      uVar7 = 0x949;
      goto LAB_00201a40;
    }
    sVar6 = fread(&local_1498,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "location";
      uVar9 = 1;
      uVar7 = 0x94a;
      goto LAB_0020184a;
    }
    sVar6 = (size_t)local_1498;
    if (sVar6 != 0) {
      pcVar5 = "only node data location plt implemented";
      uVar7 = 0x94b;
      goto LAB_00201847;
    }
    sVar6 = fread(&local_149c,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "neighbor";
      uVar9 = 1;
      uVar7 = 0x94c;
      goto LAB_0020184a;
    }
    sVar6 = (size_t)local_149c;
    if (sVar6 != 0) {
      pcVar5 = "no face neighbor  plt implemented";
      uVar7 = 0x94d;
      goto LAB_00201847;
    }
    local_14ac = 0;
    if (-1 < local_1488) {
      iVar2 = 0;
      do {
        sVar6 = fread(&local_14ac,4,1,(FILE *)file);
        if (sVar6 != 1) {
          pcVar5 = "mystery";
          uVar9 = 1;
          uVar7 = 0x953;
          goto LAB_0020184a;
        }
      } while ((iVar2 < local_1488) && (iVar2 = iVar2 + 1, local_14ac == 0));
    }
    uVar3 = ref_list_push(local_1470,local_14ac);
    if (uVar3 != 0) {
      pcVar5 = "save nnode";
      uVar7 = 0x957;
      goto LAB_00201a40;
    }
    sVar6 = fread(&local_14a0,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "numelem";
      uVar9 = 1;
      uVar7 = 0x958;
      goto LAB_0020184a;
    }
    uVar3 = ref_list_push(local_1458,local_14a0);
    if (uVar3 != 0) {
      pcVar5 = "save nelem";
      uVar7 = 0x959;
      goto LAB_00201a40;
    }
    iVar2 = 3;
    do {
      sVar6 = fread(&local_14a4,4,1,(FILE *)file);
      if (sVar6 != 1) {
        pcVar5 = "dim";
        uVar9 = 1;
        uVar7 = 0x95c;
        goto LAB_0020184a;
      }
      sVar6 = (size_t)local_14a4;
      if (sVar6 != 0) {
        pcVar5 = "dim nonzero plt";
        uVar7 = 0x95d;
        goto LAB_00201847;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    sVar6 = fread(&local_14a8,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "aux";
      uVar9 = 1;
      uVar7 = 0x95f;
      goto LAB_0020184a;
    }
    sVar6 = (size_t)local_14a8;
    if (sVar6 != 0) {
      pcVar5 = "aux nonzero plt";
      uVar7 = 0x960;
      goto LAB_00201847;
    }
    sVar6 = fread(&local_14b0,4,1,(FILE *)file);
    uVar7 = extraout_RDX_03;
    if (sVar6 != 1) break;
LAB_00201c4e:
    dVar11 = (double)local_14b0;
    dVar10 = 299.0 - dVar11;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    if (1e-07 <= dVar10) {
      dVar10 = 357.0 - dVar11;
      if (dVar10 <= -dVar10) {
        dVar10 = -dVar10;
      }
      if (3.57e-10 < dVar10) {
        printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",0x4076500000000000,
               dVar11,dVar10,0x3df888691125076a,
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x965,"ref_part_plt_header","end of header marker expected");
        return 1;
      }
      return 0;
    }
    RVar4 = ref_part_plt_string(file,local_c38,(int)uVar7);
    if (RVar4 != 0) {
      pcVar5 = "read zonename";
      uVar7 = 0x93e;
LAB_00201c2b:
      uVar3 = 1;
      uVar8 = 1;
      goto LAB_00201a43;
    }
    sVar6 = fread(local_1444,4,1,(FILE *)file);
    if (sVar6 != 1) {
      pcVar5 = "parent";
      uVar9 = 1;
      uVar7 = 0x941;
      goto LAB_0020184a;
    }
  }
  pcVar5 = "zonemarker";
  uVar9 = 1;
  uVar7 = 0x962;
  goto LAB_0020184a;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_header(FILE *file, REF_INT *nvar,
                                              REF_LIST zone_type,
                                              REF_LIST zone_packing,
                                              REF_LIST zone_nnode,
                                              REF_LIST zone_nelem) {
  char header[9];
  int endian, filetype;
  char title[1024], varname[1024], zonename[1024];
  char auxname[1024], auxvalue[1024];
  int var, numvar;
  float zonemarker;
  int parent, strand, notused, zonetype, packing, location, neighbor;
  double solutiontime;
  int miscellaneous, i;
  int numpts, numelem;
  int dim, aux, auxiliary_value_format;
  REF_BOOL verbose = REF_FALSE;

  RAS(header == fgets(header, 6, file), "header error");
  header[5] = '\0';
  REIS(0, strncmp(header, "#!TDV", 5), "header '#!TDV' missing")
  RAS(header == fgets(header, 4, file), "version error");
  header[4] = '\0';
  REIS(0, strncmp(header, "112", 5), "expected version '112'")

  REIS(1, fread(&endian, sizeof(int), 1, file), "magic");
  REIS(1, endian, "expected little endian plt");
  REIS(1, fread(&filetype, sizeof(int), 1, file), "filetype");
  REIS(0, filetype, "expected full filetype");

  RSS(ref_part_plt_string(file, title, 1024), "read title");
  if (verbose) printf("plt title '%s'\n", title);

  REIS(1, fread(&numvar, sizeof(int), 1, file), "numvar");
  if (verbose) printf("plt number of variables %d\n", numvar);
  *nvar = numvar;

  for (var = 0; var < numvar; var++) {
    RSS(ref_part_plt_string(file, varname, 1024), "read variable name");
    if (verbose) printf("plt variable name %d '%s'\n", var, varname);
  }

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");

  while (ABS(799.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, auxname, 1024), "read auxname");
    if (verbose) printf("plt auxname '%s'\n", auxname);
    REIS(1, fread(&auxiliary_value_format, sizeof(int), 1, file),
         "auxiliary_value_format");
    RSS(ref_part_plt_string(file, auxvalue, 1024), "read auxvalue");
    if (verbose) printf("plt auxvalue '%s'\n", auxvalue);
    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  while (ABS(299.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, zonename, 1024), "read zonename");
    if (verbose) printf("plt zonename '%s'\n", zonename);

    REIS(1, fread(&parent, sizeof(int), 1, file), "parent");
    REIS(1, fread(&strand, sizeof(int), 1, file), "strand");
    REIS(1, fread(&solutiontime, sizeof(double), 1, file), "solutiontime");
    REIS(1, fread(&notused, sizeof(int), 1, file), "notused");
    REIS(-1, notused, "not unused should be -1 plt");
    REIS(1, fread(&zonetype, sizeof(int), 1, file), "zonetype");
    RSS(ref_list_push(zone_type, zonetype), "save zonetype");
    REIS(1, fread(&packing, sizeof(int), 1, file), "packing");
    RSS(ref_list_push(zone_packing, packing), "save packing");
    REIS(1, fread(&location, sizeof(int), 1, file), "location");
    REIS(0, location, "only node data location plt implemented");
    REIS(1, fread(&neighbor, sizeof(int), 1, file), "neighbor");
    REIS(0, neighbor, "no face neighbor  plt implemented");

    /* there seem to be numvar extra zeros in USM3D volume files */
    /* assume numpts is first nonzero */
    miscellaneous = 0;
    for (i = 0; (i < (numvar + 1)) && (0 == miscellaneous); i++) {
      REIS(1, fread(&miscellaneous, sizeof(int), 1, file), "mystery");
    }
    numpts = miscellaneous;

    RSS(ref_list_push(zone_nnode, numpts), "save nnode");
    REIS(1, fread(&numelem, sizeof(int), 1, file), "numelem");
    RSS(ref_list_push(zone_nelem, numelem), "save nelem");

    for (i = 0; i < 3; i++) {
      REIS(1, fread(&dim, sizeof(int), 1, file), "dim");
      REIS(0, dim, "dim nonzero plt");
    }
    REIS(1, fread(&aux, sizeof(int), 1, file), "aux");
    REIS(0, aux, "aux nonzero plt");

    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  RWDS(357.0, (double)zonemarker, -1.0, "end of header marker expected");

  return REF_SUCCESS;
}